

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O0

int __thiscall UEFIToolApplication::startup(UEFIToolApplication *this)

{
  UEFITool *pUVar1;
  int iVar2;
  const_reference pQVar3;
  qsizetype qVar4;
  QList<QString> local_98;
  QString local_80;
  QList<QString> local_68;
  QList<QString> local_40;
  QString local_28;
  UEFIToolApplication *local_10;
  UEFIToolApplication *this_local;
  
  pUVar1 = this->tool;
  local_10 = this;
  QCoreApplication::arguments();
  pQVar3 = QList<QString>::at(&local_40,0);
  QString::QString(&local_28,pQVar3);
  UEFITool::setProgramPath(pUVar1,&local_28);
  QString::~QString(&local_28);
  QList<QString>::~QList(&local_40);
  QCoreApplication::arguments();
  qVar4 = QList<QString>::length(&local_68);
  QList<QString>::~QList(&local_68);
  if (1 < qVar4) {
    pUVar1 = this->tool;
    QCoreApplication::arguments();
    pQVar3 = QList<QString>::at(&local_98,1);
    QString::QString(&local_80,pQVar3);
    UEFITool::openImageFile(pUVar1,&local_80);
    QString::~QString(&local_80);
    QList<QString>::~QList(&local_98);
  }
  QWidget::show();
  iVar2 = QApplication::exec();
  return iVar2;
}

Assistant:

int startup()
    {
        tool->setProgramPath(arguments().at(0));
        if (arguments().length() > 1)
            tool->openImageFile(arguments().at(1));
        tool->show();
        
        return exec();
    }